

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles3::Performance::anon_unknown_0::BaseCase::iterate(BaseCase *this)

{
  undefined1 *this_00;
  glBindRenderbufferFunc p_Var1;
  glBindFramebufferFunc p_Var2;
  glFramebufferRenderbufferFunc p_Var3;
  RenderContext *context;
  PtrData<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
  data;
  PtrData<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
  data_00;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  uint uVar7;
  deBool dVar8;
  undefined4 extraout_var;
  TestLog *log_00;
  char *str;
  CommandLine *this_01;
  RenderData *pRVar9;
  TestError *pTVar10;
  RenderData *pRVar11;
  iterator first;
  iterator last;
  size_type sVar12;
  reference pvVar13;
  RenderData *in_stack_fffffffffffffad8;
  undefined8 in_stack_fffffffffffffae0;
  allocator<char> *__a;
  allocator<char> local_419;
  string local_418;
  allocator<char> local_3f1;
  string local_3f0;
  undefined1 local_3d0 [8];
  Sample sample;
  undefined4 uStack_3a8;
  int workload_1;
  size_t ndx;
  int local_38c;
  int local_388;
  int count;
  int workload;
  int step;
  PixelBufferAccess local_358;
  DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData> local_32a;
  undefined1 local_329;
  ObjectData local_328;
  PtrData<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
  local_240;
  PtrData<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
  *local_230;
  DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData> local_21a;
  undefined1 local_219;
  ObjectData local_218;
  PtrData<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
  local_130;
  PtrData<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
  *local_120;
  undefined1 local_10c [8];
  Random rng;
  int maxWorkload;
  undefined1 local_f0 [8];
  TextureLevel resultTex;
  RenderDataP occludedData;
  RenderDataP occluderData;
  vector<int,_std::allocator<int>_> params;
  vector<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
  results;
  Renderbuffer depthbuffer;
  undefined1 local_50 [8];
  Renderbuffer renderbuffer;
  Framebuffer framebuffer;
  TestLog *log;
  Functions *gl;
  BaseCase *this_local;
  Functions *gl_00;
  
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar5);
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)&renderbuffer.super_ObjectWrapper.m_object,
             gl_00);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)2> *)local_50,gl_00);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)2> *)
             &results.
              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,gl_00);
  std::
  vector<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
  ::vector((vector<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
            *)&params.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &occluderData.
              super_UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
              .m_data.field_0x8);
  de::details::
  MovePtr<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
  ::MovePtr((MovePtr<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
             *)&occludedData.
                super_UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
                .m_data.field_0x8);
  de::details::
  MovePtr<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
  ::MovePtr((MovePtr<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
             *)&resultTex.m_data.m_cap);
  tcu::TextureFormat::TextureFormat((TextureFormat *)&rng.m_rnd.w,RGBA,UNORM_INT8);
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)local_f0,(TextureFormat *)&rng.m_rnd.w,0x200,0x200,1);
  rng.m_rnd.z = 0;
  str = tcu::TestNode::getName((TestNode *)this);
  dVar6 = deStringHash(str);
  dVar6 = ::deInt32Hash(dVar6);
  this_01 = tcu::TestContext::getCommandLine((this->super_TestCase).super_TestNode.m_testCtx);
  uVar7 = tcu::CommandLine::getBaseSeed(this_01);
  de::Random::Random((Random *)local_10c,dVar6 ^ uVar7);
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[6])();
  p_Var1 = gl_00->bindRenderbuffer;
  dVar6 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_50);
  (*p_Var1)(0x8d41,dVar6);
  (*gl_00->renderbufferStorage)(0x8d41,0x8058,0x200,0x200);
  p_Var1 = gl_00->bindRenderbuffer;
  dVar6 = glu::ObjectWrapper::operator*
                    ((ObjectWrapper *)
                     &results.
                      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  (*p_Var1)(0x8d41,dVar6);
  (*gl_00->renderbufferStorage)(0x8d41,0x88f0,0x200,0x200);
  p_Var2 = gl_00->bindFramebuffer;
  dVar6 = glu::ObjectWrapper::operator*((ObjectWrapper *)&renderbuffer.super_ObjectWrapper.m_object)
  ;
  (*p_Var2)(0x8d40,dVar6);
  p_Var3 = gl_00->framebufferRenderbuffer;
  dVar6 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_50);
  (*p_Var3)(0x8d40,0x8ce0,0x8d41,dVar6);
  p_Var3 = gl_00->framebufferRenderbuffer;
  dVar6 = glu::ObjectWrapper::operator*
                    ((ObjectWrapper *)
                     &results.
                      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  (*p_Var3)(0x8d40,0x8d00,0x8d41,dVar6);
  (*gl_00->viewport)(0,0,0x200,0x200);
  (*gl_00->clearColor)(0.125,0.25,0.5,1.0);
  rng.m_rnd.z = (*(this->super_TestCase).super_TestNode._vptr_TestNode[9])();
  pRVar9 = (RenderData *)operator_new(0x108);
  local_219 = 1;
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[7])(&local_218);
  RenderData::RenderData(pRVar9,&local_218,this->m_renderCtx,log_00);
  local_219 = 0;
  de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>::DefaultDeleter
            (&local_21a);
  de::details::
  MovePtr<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
  ::MovePtr((MovePtr<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
             *)&local_130);
  local_120 = de::details::MovePtr::operator_cast_to_PtrData(&local_130,(MovePtr *)pRVar9);
  data._8_8_ = in_stack_fffffffffffffae0;
  data.ptr = in_stack_fffffffffffffad8;
  de::details::
  MovePtr<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
  ::operator=((MovePtr<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
               *)&occludedData.
                  super_UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
                  .m_data.field_0x8,data);
  de::details::
  MovePtr<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
  ::~MovePtr((MovePtr<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
              *)&local_130);
  ObjectData::~ObjectData(&local_218);
  pRVar9 = (RenderData *)operator_new(0x108);
  local_329 = 1;
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[8])(&local_328);
  RenderData::RenderData(pRVar9,&local_328,this->m_renderCtx,log_00);
  local_329 = 0;
  de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>::DefaultDeleter
            (&local_32a);
  de::details::
  MovePtr<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
  ::MovePtr((MovePtr<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
             *)&local_240);
  local_230 = de::details::MovePtr::operator_cast_to_PtrData(&local_240,(MovePtr *)pRVar9);
  data_00._8_8_ = in_stack_fffffffffffffae0;
  data_00.ptr = in_stack_fffffffffffffad8;
  de::details::
  MovePtr<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
  ::operator=((MovePtr<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
               *)&resultTex.m_data.m_cap,data_00);
  de::details::
  MovePtr<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
  ::~MovePtr((MovePtr<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
              *)&local_240);
  ObjectData::~ObjectData(&local_328);
  do {
    dVar8 = ::deGetFalse();
    if (dVar8 != 0) {
LAB_01fa8dad:
      pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar10,(char *)0x0,"occluderData->m_program.isOk()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pDepthTests.cpp"
                 ,0x243);
      __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    pRVar9 = de::details::
             UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
             ::operator->((UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
                           *)&occludedData.
                              super_UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
                              .m_data.field_0x8);
    bVar4 = glu::ShaderProgram::isOk(&pRVar9->m_program);
    if (!bVar4) goto LAB_01fa8dad;
    dVar8 = ::deGetFalse();
  } while (dVar8 != 0);
  while (dVar8 = ::deGetFalse(), dVar8 == 0) {
    pRVar9 = de::details::
             UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
             ::operator->((UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
                           *)&resultTex.m_data.m_cap);
    bVar4 = glu::ShaderProgram::isOk(&pRVar9->m_program);
    if (!bVar4) break;
    dVar8 = ::deGetFalse();
    if (dVar8 == 0) {
      (*gl_00->clear)(0x4500);
      (*gl_00->enable)(0xb71);
      pRVar9 = de::details::
               UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
               ::operator*((UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
                            *)&occludedData.
                               super_UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
                               .m_data.field_0x8);
      render(this,pRVar9);
      pRVar9 = de::details::
               UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
               ::operator*((UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
                            *)&resultTex.m_data.m_cap);
      render(this,pRVar9);
      context = this->m_renderCtx;
      tcu::TextureLevel::getAccess(&local_358,(TextureLevel *)local_f0);
      glu::readPixels(context,0,0,&local_358);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&workload,(TextureLevel *)local_f0);
      pRVar9 = de::details::
               UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
               ::operator->((UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
                             *)&occludedData.
                                super_UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
                                .m_data.field_0x8);
      pRVar11 = de::details::
                UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
                ::operator->((UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
                              *)&resultTex.m_data.m_cap);
      logGeometry(this,(ConstPixelBufferAccess *)&workload,&pRVar9->m_program,&pRVar11->m_program);
      std::vector<int,_std::allocator<int>_>::reserve
                ((vector<int,_std::allocator<int>_> *)
                 &occluderData.
                  super_UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
                  .m_data.field_0x8,0xa0);
      for (count = 0; count < 10; count = count + 1) {
        local_388 = (int)(rng.m_rnd.z * count) / 10;
        for (local_38c = 0; local_38c < 0x10; local_38c = local_38c + 1) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     &occluderData.
                      super_UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
                      .m_data.field_0x8,&local_388);
        }
      }
      this_00 = &occluderData.
                 super_UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
                 .m_data.field_0x8;
      first = std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)this_00);
      last = std::vector<int,_std::allocator<int>_>::end
                       ((vector<int,_std::allocator<int>_> *)this_00);
      de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                ((Random *)local_10c,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)first._M_current
                 ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)last._M_current
                );
      for (_uStack_3a8 = 0;
          sVar12 = std::vector<int,_std::allocator<int>_>::size
                             ((vector<int,_std::allocator<int>_> *)
                              &occluderData.
                               super_UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
                               .m_data.field_0x8), _uStack_3a8 < sVar12;
          _uStack_3a8 = _uStack_3a8 + 1) {
        pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)
                             &occluderData.
                              super_UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
                              .m_data.field_0x8,_uStack_3a8);
        sample.workload = *pvVar13;
        pRVar9 = de::details::
                 UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
                 ::operator*((UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
                              *)&occludedData.
                                 super_UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
                                 .m_data.field_0x8);
        pRVar11 = de::details::
                  UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
                  ::operator*((UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
                               *)&resultTex.m_data.m_cap);
        (*(this->super_TestCase).super_TestNode._vptr_TestNode[10])
                  (local_3d0,this,pRVar9,pRVar11,(ulong)(uint)sample.workload);
        sample.testTime._4_4_ = sample.workload;
        sample.testTime._0_4_ = uStack_3a8;
        std::
        vector<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
        ::push_back((vector<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
                     *)&params.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,(value_type *)local_3d0);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"Samples",&local_3f1);
      __a = &local_419;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"Samples",__a);
      logSamples(this,(vector<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
                       *)&params.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,&local_3f0,&local_418);
      std::__cxx11::string::~string((string *)&local_418);
      std::allocator<char>::~allocator(&local_419);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::allocator<char>::~allocator(&local_3f1);
      (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])
                (this,&params.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
      tcu::ResultCollector::setTestContextResult
                (&this->m_results,(this->super_TestCase).super_TestNode.m_testCtx);
      de::Random::~Random((Random *)local_10c);
      tcu::TextureLevel::~TextureLevel((TextureLevel *)local_f0);
      de::details::
      MovePtr<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
      ::~MovePtr((MovePtr<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
                  *)&resultTex.m_data.m_cap);
      de::details::
      MovePtr<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
      ::~MovePtr((MovePtr<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
                  *)&occludedData.
                     super_UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
                     .m_data.field_0x8);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 &occluderData.
                  super_UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
                  .m_data.field_0x8);
      std::
      vector<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
      ::~vector((vector<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
                 *)&params.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      glu::TypedObjectWrapper<(glu::ObjectType)2>::~TypedObjectWrapper
                ((TypedObjectWrapper<(glu::ObjectType)2> *)
                 &results.
                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      glu::TypedObjectWrapper<(glu::ObjectType)2>::~TypedObjectWrapper
                ((TypedObjectWrapper<(glu::ObjectType)2> *)local_50);
      glu::TypedObjectWrapper<(glu::ObjectType)3>::~TypedObjectWrapper
                ((TypedObjectWrapper<(glu::ObjectType)3> *)
                 &renderbuffer.super_ObjectWrapper.m_object);
      return STOP;
    }
  }
  pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar10,(char *)0x0,"occludedData->m_program.isOk()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pDepthTests.cpp"
             ,0x244);
  __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

BaseCase::IterateResult BaseCase::iterate (void)
{
	typedef de::MovePtr<RenderData> RenderDataP;

	const glw::Functions&	gl					= m_renderCtx.getFunctions();
	TestLog&				log					= m_testCtx.getLog();

	const glu::Framebuffer	framebuffer			(gl);
	const glu::Renderbuffer	renderbuffer		(gl);
	const glu::Renderbuffer	depthbuffer			(gl);

	vector<Sample>			results;
	vector<int>				params;
	RenderDataP				occluderData;
	RenderDataP				occludedData;
	tcu::TextureLevel		resultTex			(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), RENDER_SIZE, RENDER_SIZE);
	int						maxWorkload			= 0;
	de::Random				rng					(deInt32Hash(deStringHash(getName())) ^ m_testCtx.getCommandLine().getBaseSeed());

	logDescription();

	gl.bindRenderbuffer(GL_RENDERBUFFER, *renderbuffer);
	gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, RENDER_SIZE, RENDER_SIZE);
	gl.bindRenderbuffer(GL_RENDERBUFFER, *depthbuffer);
	gl.renderbufferStorage(GL_RENDERBUFFER, GL_DEPTH24_STENCIL8, RENDER_SIZE, RENDER_SIZE);

	gl.bindFramebuffer(GL_FRAMEBUFFER, *framebuffer);
	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *renderbuffer);
	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, *depthbuffer);
	gl.viewport(0, 0, RENDER_SIZE, RENDER_SIZE);
	gl.clearColor(0.125f, 0.25f, 0.5f, 1.0f);

	maxWorkload = calibrate();

	// Setup data
	occluderData = RenderDataP(new RenderData (genOccluderGeometry(), m_renderCtx, log));
	occludedData = RenderDataP(new RenderData (genOccludedGeometry(), m_renderCtx, log));

	TCU_CHECK(occluderData->m_program.isOk());
	TCU_CHECK(occludedData->m_program.isOk());

	// Force initialization of GPU resources
	gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
	gl.enable(GL_DEPTH_TEST);

	render(*occluderData);
	render(*occludedData);
	glu::readPixels(m_renderCtx, 0, 0, resultTex.getAccess());

	logGeometry(resultTex.getAccess(), occluderData->m_program, occludedData->m_program);

	params.reserve(ITERATION_STEPS*ITERATION_SAMPLES);

	// Setup parameters
	for (int step = 0; step < ITERATION_STEPS; step++)
	{
		const int workload = maxWorkload*step/ITERATION_STEPS;

		for (int count = 0; count < ITERATION_SAMPLES; count++)
			params.push_back(workload);
	}

	rng.shuffle(params.begin(), params.end());

	// Render samples
	for (size_t ndx = 0; ndx < params.size(); ndx++)
	{
		const int	workload	= params[ndx];
		Sample		sample		= renderSample(*occluderData, *occludedData, workload);

		sample.workload = workload;
		sample.order = int(ndx);

		results.push_back(sample);
	}

	logSamples(results, "Samples", "Samples");
	logAnalysis(results);

	m_results.setTestContextResult(m_testCtx);

	return STOP;
}